

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O2

int __thiscall
qclab::io::QASMFile::
parse2const<qclab::qgates::SWAP<std::complex<double>>,qclab::QObject<std::complex<double>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
          *gate)

{
  QObject<std::complex<double>_> *pQVar1;
  _Alloc_hider _Var2;
  __type _Var3;
  int iVar4;
  string *psVar5;
  int qubit1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int qubit0;
  
  std::__cxx11::string::substr((ulong)&local_70,(ulong)command);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qubit0,name,
                 &this->qregName_);
  _Var3 = std::operator==(&local_70,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &qubit0);
  std::__cxx11::string::~string((string *)&qubit0);
  std::__cxx11::string::~string((string *)&local_70);
  iVar4 = 0;
  if (_Var3) {
    psVar5 = (string *)std::__cxx11::string::erase((ulong)command,0);
    qubit0 = parseQubit(this,psVar5);
    psVar5 = (string *)std::__cxx11::string::erase((ulong)command,0);
    parseQubit(this,psVar5);
    std::make_unique<qclab::qgates::SWAP<std::complex<double>>,int_const&,int_const&>
              ((int *)&local_70,&qubit0);
    _Var2._M_p = local_70._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)0x0;
    pQVar1 = (gate->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl;
    (gate->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl =
         (QObject<std::complex<double>_> *)_Var2._M_p;
    if (pQVar1 != (QObject<std::complex<double>_> *)0x0) {
      (*pQVar1->_vptr_QObject[0xd])();
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 0x68))();
      }
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int parse2const( std::string name , std::string& command ,
                       std::unique_ptr< GATE >& gate ) const {
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + n2 ) == name + qregName_ ) {
          const auto qubit0 = parseQubit( command.erase( 0 , n1 + n2 + 1 ) ) ;
          const auto qubit1 = parseQubit( command.erase( 0 , n2 + 2 ) ) ;
          gate = std::make_unique< G >( qubit0 , qubit1 ) ;
          return 1 ;
        }
        return 0 ;
      }